

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffpbyt(fitsfile *fptr,LONGLONG nbytes,void *buffer,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  size_t local_88;
  long local_80;
  void *local_78;
  char *cptr;
  long nwrite;
  long nspace;
  long bufpos;
  long ntodo;
  long recend;
  long recstart;
  LONGLONG filepos;
  int nbuff;
  int ii;
  int *status_local;
  void *buffer_local;
  LONGLONG nbytes_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (nbytes <= 0x7fffffffffffffff) {
      if (fptr->Fptr->curbuf < 0) {
        ffldrc(fptr,fptr->Fptr->bytepos / 0xb40,0,status);
      }
      local_78 = buffer;
      bufpos = nbytes;
      if (nbytes < 0x21c0) {
        nspace = fptr->Fptr->bytepos + fptr->Fptr->bufrecnum[fptr->Fptr->curbuf] * -0xb40;
        nwrite = 0xb40 - nspace;
        while (bufpos != 0) {
          if (bufpos < nwrite) {
            local_88 = bufpos;
          }
          else {
            local_88 = nwrite;
          }
          memcpy(fptr->Fptr->iobuffer + nspace + fptr->Fptr->curbuf * 0xb40,local_78,local_88);
          bufpos = bufpos - local_88;
          local_78 = (void *)(local_88 + (long)local_78);
          fptr->Fptr->bytepos = local_88 + fptr->Fptr->bytepos;
          fptr->Fptr->dirty[fptr->Fptr->curbuf] = 1;
          if (bufpos != 0) {
            ffldrc(fptr,fptr->Fptr->bytepos / 0xb40,1,status);
            nspace = 0;
            nwrite = 0xb40;
          }
        }
      }
      else {
        iVar1 = fptr->Fptr->curbuf;
        recstart = fptr->Fptr->bytepos;
        lVar5 = fptr->Fptr->bufrecnum[iVar1];
        lVar2 = (recstart + nbytes + -1) / 0xb40;
        lVar3 = recstart + lVar5 * -0xb40;
        sVar4 = 0xb40 - lVar3;
        if (sVar4 != 0) {
          memcpy(fptr->Fptr->iobuffer + lVar3 + iVar1 * 0xb40,buffer,sVar4);
          bufpos = nbytes - sVar4;
          local_78 = (void *)(sVar4 + (long)buffer);
          recstart = sVar4 + recstart;
          fptr->Fptr->dirty[iVar1] = 1;
        }
        for (filepos._4_4_ = 0; filepos._4_4_ < 0x28; filepos._4_4_ = filepos._4_4_ + 1) {
          if ((lVar5 <= fptr->Fptr->bufrecnum[filepos._4_4_]) &&
             (fptr->Fptr->bufrecnum[filepos._4_4_] <= lVar2)) {
            if (fptr->Fptr->dirty[filepos._4_4_] != 0) {
              ffbfwt(fptr->Fptr,filepos._4_4_,status);
            }
            fptr->Fptr->bufrecnum[filepos._4_4_] = -1;
          }
        }
        if (fptr->Fptr->io_pos != recstart) {
          ffseek(fptr->Fptr,recstart);
        }
        lVar5 = (bufpos + -1) / 0xb40;
        lVar3 = lVar5 * 0xb40;
        ffwrite(fptr->Fptr,lVar3,local_78,status);
        sVar4 = bufpos + lVar5 * -0xb40;
        fptr->Fptr->io_pos = recstart + lVar3;
        if (fptr->Fptr->io_pos < fptr->Fptr->filesize) {
          ffread(fptr->Fptr,0xb40,fptr->Fptr->iobuffer + iVar1 * 0xb40,status);
          fptr->Fptr->io_pos = fptr->Fptr->io_pos + 0xb40;
        }
        else {
          fptr->Fptr->filesize = fptr->Fptr->io_pos;
          if (fptr->Fptr->hdutype == 1) {
            memset(fptr->Fptr->iobuffer + iVar1 * 0xb40,0x20,0xb40);
          }
          else {
            memset(fptr->Fptr->iobuffer + iVar1 * 0xb40,0,0xb40);
          }
        }
        memcpy(fptr->Fptr->iobuffer + iVar1 * 0xb40,(void *)(lVar3 + (long)local_78),sVar4);
        fptr->Fptr->dirty[iVar1] = 1;
        fptr->Fptr->bufrecnum[iVar1] = lVar2;
        lVar5 = fptr->Fptr->logfilesize;
        lVar6 = (lVar2 + 1) * 0xb40;
        if (lVar5 == lVar6 || SBORROW8(lVar5,lVar6) != lVar5 + (lVar2 + 1) * -0xb40 < 0) {
          local_80 = (lVar2 + 1) * 0xb40;
        }
        else {
          local_80 = fptr->Fptr->logfilesize;
        }
        fptr->Fptr->logfilesize = local_80;
        fptr->Fptr->bytepos = recstart + lVar3 + sVar4;
      }
      fptr_local._4_4_ = *status;
    }
    else {
      ffpmsg("Number of bytes to write is greater than LONG_MAX (ffpbyt).");
      *status = 0x6a;
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpbyt(fitsfile *fptr,   /* I - FITS file pointer                    */
           LONGLONG nbytes,      /* I - number of bytes to write             */
           void *buffer,     /* I - buffer containing the bytes to write */
           int *status)      /* IO - error status                        */
/*
  put (write) the buffer of bytes to the output FITS file, starting at
  the current file position.  Write large blocks of data directly to disk;
  write smaller segments to intermediate IO buffers to improve efficiency.
*/
{
    int ii, nbuff;
    LONGLONG filepos;
    long recstart, recend;
    long ntodo, bufpos, nspace, nwrite;
    char *cptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nbytes > LONG_MAX) {
        ffpmsg("Number of bytes to write is greater than LONG_MAX (ffpbyt).");
        *status = WRITE_ERROR;
	return(*status);
    }
    
    ntodo =  (long) nbytes;
    cptr = (char *)buffer;

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    if (nbytes >= MINDIRECT)
    {
      /* write large blocks of data directly to disk instead of via buffers */
      /* first, fill up the current IO buffer before flushing it to disk */

      nbuff = (fptr->Fptr)->curbuf;      /* current IO buffer number */
      filepos = (fptr->Fptr)->bytepos;   /* save the write starting position */
      recstart = (fptr->Fptr)->bufrecnum[nbuff];                 /* starting record */
      recend = (long) ((filepos + nbytes - 1) / IOBUFLEN);  /* ending record   */

      /* bufpos is the starting position within the IO buffer */
      bufpos = (long) (filepos - ((LONGLONG)recstart * IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      if (nspace)
      { /* fill up the IO buffer */
        memcpy((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN) + bufpos, cptr, nspace);
        ntodo -= nspace;           /* decrement remaining number of bytes */
        cptr += nspace;            /* increment user buffer pointer */
        filepos += nspace;         /* increment file position pointer */
        (fptr->Fptr)->dirty[nbuff] = TRUE;       /* mark record as having been modified */
      }

      for (ii = 0; ii < NIOBUF; ii++) /* flush any affected buffers to disk */
      {
        if ((fptr->Fptr)->bufrecnum[ii] >= recstart
            && (fptr->Fptr)->bufrecnum[ii] <= recend )
        {
          if ((fptr->Fptr)->dirty[ii])        /* flush modified buffer to disk */
             ffbfwt(fptr->Fptr, ii, status);

          (fptr->Fptr)->bufrecnum[ii] = -1;  /* disassociate buffer from the file */
        }
      }

      /* move to the correct write position */
      if ((fptr->Fptr)->io_pos != filepos)
         ffseek(fptr->Fptr, filepos);

      nwrite = ((ntodo - 1) / IOBUFLEN) * IOBUFLEN; /* don't write last buff */

      ffwrite(fptr->Fptr, nwrite, cptr, status); /* write the data */
      ntodo -= nwrite;                /* decrement remaining number of bytes */
      cptr += nwrite;                  /* increment user buffer pointer */
      (fptr->Fptr)->io_pos = filepos + nwrite; /* update the file position */

      if ((fptr->Fptr)->io_pos >= (fptr->Fptr)->filesize) /* at the EOF? */
      {
        (fptr->Fptr)->filesize = (fptr->Fptr)->io_pos; /* increment file size */

        /* initialize the current buffer with the correct fill value */
        if ((fptr->Fptr)->hdutype == ASCII_TBL)
          memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), 32, IOBUFLEN);  /* blank fill */
        else
          memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN),  0, IOBUFLEN);  /* zero fill */
      }
      else
      {
        /* read next record */
        ffread(fptr->Fptr, IOBUFLEN, (fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), status);
        (fptr->Fptr)->io_pos += IOBUFLEN; 
      }

      /* copy remaining bytes from user buffer into current IO buffer */
      memcpy((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), cptr, ntodo);
      (fptr->Fptr)->dirty[nbuff] = TRUE;       /* mark record as having been modified */
      (fptr->Fptr)->bufrecnum[nbuff] = recend; /* record number */

      (fptr->Fptr)->logfilesize = maxvalue((fptr->Fptr)->logfilesize, 
                                       (LONGLONG)(recend + 1) * IOBUFLEN);
      (fptr->Fptr)->bytepos = filepos + nwrite + ntodo;
    }
    else
    {
      /* bufpos is the starting position in IO buffer */
      bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)(fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf] *
               IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      while (ntodo)
      {
        nwrite = minvalue(ntodo, nspace);

        /* copy bytes from user's buffer to the IO buffer */
        memcpy((fptr->Fptr)->iobuffer + ((fptr->Fptr)->curbuf * IOBUFLEN) + bufpos, cptr, nwrite);
        ntodo -= nwrite;            /* decrement remaining number of bytes */
        cptr += nwrite;
        (fptr->Fptr)->bytepos += nwrite;  /* increment file position pointer */
        (fptr->Fptr)->dirty[(fptr->Fptr)->curbuf] = TRUE; /* mark record as modified */

        if (ntodo)                  /* load next record into a buffer */
        {
          ffldrc(fptr, (long) ((fptr->Fptr)->bytepos / IOBUFLEN), IGNORE_EOF, status);
          bufpos = 0;
          nspace = IOBUFLEN;
        }
      }
    }
    return(*status);
}